

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::AdamOptimizer::SharedCtor(AdamOptimizer *this)

{
  AdamOptimizer *this_local;
  
  memset(&this->learningrate_,0,0x28);
  this->_cached_size_ = 0;
  return;
}

Assistant:

void AdamOptimizer::SharedCtor() {
  ::memset(&learningrate_, 0, reinterpret_cast<char*>(&eps_) -
    reinterpret_cast<char*>(&learningrate_) + sizeof(eps_));
  _cached_size_ = 0;
}